

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void DockNodeSetupHostWindow(ImGuiDockNode *node,ImGuiWindow *host_window)

{
  ImGuiWindow *host_window_local;
  ImGuiDockNode *node_local;
  
  if (((node->HostWindow != (ImGuiWindow *)0x0) && (node->HostWindow != host_window)) &&
     (node->HostWindow->DockNodeAsHost == node)) {
    node->HostWindow->DockNodeAsHost = (ImGuiDockNode *)0x0;
  }
  host_window->DockNodeAsHost = node;
  node->HostWindow = host_window;
  return;
}

Assistant:

static void DockNodeSetupHostWindow(ImGuiDockNode* node, ImGuiWindow* host_window)
{
    // Remove ourselves from any previous different host window
    // This can happen if a user mistakenly does (see #4295 for details):
    //  - N+0: DockBuilderAddNode(id, 0)    // missing ImGuiDockNodeFlags_DockSpace
    //  - N+1: NewFrame()                   // will create floating host window for that node
    //  - N+1: DockSpace(id)                // requalify node as dockspace, moving host window
    if (node->HostWindow && node->HostWindow != host_window && node->HostWindow->DockNodeAsHost == node)
        node->HostWindow->DockNodeAsHost = NULL;

    host_window->DockNodeAsHost = node;
    node->HostWindow = host_window;
}